

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntegrationPoints.h
# Opt level: O0

IntegrationPointList<2> *
anurbs::IntegrationPoints::get
          (IntegrationPointList<2> *__return_storage_ptr__,size_t degree_u,size_t degree_v,
          Interval *domain_u,Interval *domain_v)

{
  pointer *this;
  double dVar1;
  bool bVar2;
  reference __t;
  __tuple_element_t<0UL,_tuple<double,_double>_> *__elements;
  __tuple_element_t<0UL,_tuple<double,_double>_> *__elements_1;
  __tuple_element_t<1UL,_tuple<double,_double>_> *p_Var3;
  reference this_00;
  double local_d8;
  tuple<double,_double,_double> local_d0;
  tuple<double,_double> *local_b8;
  tuple<double,_double> *norm_point_v;
  const_iterator __end3;
  const_iterator __begin3;
  IntegrationPointList<1> *__range3;
  tuple<double,_double> *norm_point_u;
  const_iterator __end2;
  const_iterator __begin2;
  IntegrationPointList<1> *__range2;
  Index i;
  undefined1 local_60 [8];
  IntegrationPointList<1> integration_points_v;
  IntegrationPointList<1> integration_points_u;
  Interval *domain_v_local;
  Interval *domain_u_local;
  size_t degree_v_local;
  size_t degree_u_local;
  IntegrationPointList<2> *integration_points;
  
  get((IntegrationPointList<1> *)
      &integration_points_v.
       super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage,degree_u,domain_u);
  get((IntegrationPointList<1> *)local_60,degree_v,domain_v);
  i._3_1_ = 0;
  std::allocator<std::tuple<double,_double,_double>_>::allocator
            ((allocator<std::tuple<double,_double,_double>_> *)((long)&i + 2));
  std::
  vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>::
  vector(__return_storage_ptr__,degree_u * degree_v,
         (allocator<std::tuple<double,_double,_double>_> *)((long)&i + 2));
  std::allocator<std::tuple<double,_double,_double>_>::~allocator
            ((allocator<std::tuple<double,_double,_double>_> *)((long)&i + 2));
  __range2 = (IntegrationPointList<1> *)0x0;
  this = &integration_points_v.
          super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage;
  __end2 = std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
           begin((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *
                 )this);
  norm_point_u = (tuple<double,_double> *)
                 std::
                 vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
                 end((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                      *)this);
  while (bVar2 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
                                     *)&norm_point_u), bVar2) {
    __t = __gnu_cxx::
          __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
          ::operator*(&__end2);
    __end3 = std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::
             begin((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                    *)local_60);
    norm_point_v = (tuple<double,_double> *)
                   std::
                   vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                   ::end((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                          *)local_60);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end3,(__normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
                                       *)&norm_point_v), bVar2) {
      local_b8 = __gnu_cxx::
                 __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
                 ::operator*(&__end3);
      __elements = std::get<0ul,double,double>(__t);
      __elements_1 = std::get<0ul,double,double>(local_b8);
      p_Var3 = std::get<1ul,double,double>(__t);
      dVar1 = *p_Var3;
      p_Var3 = std::get<1ul,double,double>(local_b8);
      local_d8 = dVar1 * *p_Var3;
      std::tuple<double,_double,_double>::tuple<const_double_&,_const_double_&,_double,_true,_true>
                (&local_d0,__elements,__elements_1,&local_d8);
      this_00 = std::
                vector<std::tuple<double,_double,_double>,_std::allocator<std::tuple<double,_double,_double>_>_>
                ::operator[](__return_storage_ptr__,(size_type)__range2);
      std::tuple<double,_double,_double>::operator=(this_00,&local_d0);
      __gnu_cxx::
      __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
      ::operator++(&__end3);
      __range2 = (IntegrationPointList<1> *)
                 ((long)&(__range2->
                         super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + 1);
    }
    __gnu_cxx::
    __normal_iterator<const_std::tuple<double,_double>_*,_std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>_>
    ::operator++(&__end2);
  }
  i._3_1_ = 1;
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::~vector
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             local_60);
  std::vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>::~vector
            ((vector<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_> *)
             &integration_points_v.
              super__Vector_base<std::tuple<double,_double>,_std::allocator<std::tuple<double,_double>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return __return_storage_ptr__;
}

Assistant:

static IntegrationPointList<2> get(const size_t degree_u,
        const size_t degree_v, const Interval& domain_u,
        const Interval& domain_v)
    {
        const auto integration_points_u = get(degree_u, domain_u);
        const auto integration_points_v = get(degree_v, domain_v);

        IntegrationPointList<2> integration_points(degree_u * degree_v);

        Index i = 0;

        for (const auto& norm_point_u : integration_points_u) {
            for (const auto& norm_point_v : integration_points_v) {
                integration_points[i++] = IntegrationPoint<2>(
                    std::get<0>(norm_point_u), std::get<0>(norm_point_v),
                    std::get<1>(norm_point_u) * std::get<1>(norm_point_v));
            }
        }

        return integration_points;
    }